

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O2

void __thiscall Imf_3_2::TypedFlatImageChannel<float>::resize(TypedFlatImageChannel<float> *this)

{
  ulong uVar1;
  float *pfVar2;
  size_t i;
  ulong uVar3;
  
  if (this->_pixels != (float *)0x0) {
    operator_delete__(this->_pixels);
  }
  this->_pixels = (float *)0x0;
  ImageChannel::resize((ImageChannel *)this);
  uVar1 = (this->super_FlatImageChannel).super_ImageChannel._numPixels;
  pfVar2 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
  this->_pixels = pfVar2;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pfVar2[uVar3] = 0.0;
  }
  (*(this->super_FlatImageChannel).super_ImageChannel._vptr_ImageChannel[5])(this);
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete[] _pixels;
    _pixels = 0;

    FlatImageChannel::resize (); // may throw an exception

    _pixels = new T[numPixels ()];

    for (size_t i = 0; i < numPixels (); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}